

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::writePESPacket(TSMuxer *this)

{
  size_t sVar1;
  PESPacket *pPVar2;
  pointer ppVar3;
  AbstractStreamReader *pAVar4;
  pointer pmVar5;
  int iVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  pointer puVar9;
  long lVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  PESPacket *this_00;
  uint8_t *buffer;
  int iVar13;
  pair<int,_int> *i;
  pointer ppVar14;
  bool bVar15;
  bool bVar16;
  pair<unsigned_long,_PMTIndexData> local_40;
  
  sVar1 = (this->m_pesData).m_size;
  if (sVar1 == 0) {
    return;
  }
  uVar7 = sVar1 - 6;
  if (uVar7 < 0x10000) {
    puVar9 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar9 == (this->m_pesData).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar9 = (pointer)0x0;
    }
    puVar9[4] = (uchar)(uVar7 >> 8);
    puVar9 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar9 == (this->m_pesData).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar9 = (pointer)0x0;
    }
    puVar9[5] = (uchar)uVar7;
  }
  pmVar8 = std::
           map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
           ::operator[](&(this->m_pmt).pidList,&this->m_pesPID);
  pPVar2 = (PESPacket *)
           (this->m_pesData).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = 0;
  this_00 = (PESPacket *)0x0;
  if (pPVar2 != (PESPacket *)
                (this->m_pesData).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    this_00 = pPVar2;
  }
  bVar15 = false;
  if (this->m_computeMuxStats == true) {
    if ((char)this_00->flagsLo < '\0') {
      uVar7 = PESPacket::getPts(this_00);
      if ((pmVar8->m_index).
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (pmVar8->m_index).
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::
        vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
        ::emplace_back<>(&pmVar8->m_index);
      }
      pAVar4 = pmVar8->m_codecReader;
      bVar16 = true;
      bVar15 = true;
      if (pAVar4 != (AbstractStreamReader *)0x0) {
        lVar10 = __dynamic_cast(pAVar4,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo);
        bVar15 = lVar10 == 0;
      }
      iVar6 = (*(pAVar4->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0x12])
                        (pAVar4);
      if (pmVar8->m_codecReader != (AbstractStreamReader *)0x0) {
        lVar10 = __dynamic_cast(pmVar8->m_codecReader,&AbstractStreamReader::typeinfo,
                                &SimplePacketizerReader::typeinfo);
        bVar16 = lVar10 == 0;
      }
      if ((!bVar15) && (this->m_pesIFrame == true)) {
        if ((((char)iVar6 == '\0') || (this->m_pesSpsPps != false)) &&
           ((pmVar5 = (pmVar8->m_index).
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 ||
            (lVar10 = std::_Rb_tree_decrement
                                (&pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header),
            *(ulong *)(lVar10 + 0x20) < uVar7)))) {
          local_40.second.m_frameLen = 0;
          local_40.second.m_pktCnt =
               (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_40.first = uVar7;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
          ::_M_emplace_unique<std::pair<unsigned_long,PMTIndexData>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                      *)(pmVar5 + -1),&local_40);
          bVar15 = true;
        }
        else {
          bVar15 = false;
        }
        this->m_lastGopNullCnt = this->m_nullCnt;
        goto LAB_001df129;
      }
      if (!bVar16) {
        if (this->m_videoSecondTrackCnt == 0 && this->m_videoTrackCnt == 0) {
          this->m_lastGopNullCnt = this->m_nullCnt;
        }
        pmVar5 = (pmVar8->m_index).
                 super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (lVar10 = std::_Rb_tree_decrement
                               (&pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header),
           89999 < uVar7 - *(long *)(lVar10 + 0x20))) {
          local_40.second.m_frameLen = 0;
          local_40.second.m_pktCnt =
               (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_40.first = uVar7;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
          ::_M_emplace_unique<std::pair<unsigned_long,PMTIndexData>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                      *)(pmVar5 + -1),&local_40);
          bVar15 = true;
          goto LAB_001df129;
        }
      }
    }
    bVar15 = false;
  }
LAB_001df129:
  puVar12 = (this->m_pesData).m_data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar1 = (this->m_pesData).m_size;
  puVar11 = (uint8_t *)0x0;
  if (puVar12 !=
      (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    puVar11 = puVar12;
  }
  ppVar3 = (this->m_priorityData).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar16 = true;
  puVar12 = puVar11;
  for (ppVar14 = (this->m_priorityData).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar3; ppVar14 = ppVar14 + 1)
  {
    puVar9 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar9 == (this->m_pesData).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar9 = (pointer)0x0;
    }
    buffer = puVar9 + ppVar14->first;
    if (puVar12 <= buffer && (long)buffer - (long)puVar12 != 0) {
      iVar6 = writeTSFrames(this,this->m_pesPID,puVar12,(long)buffer - (long)puVar12,false,bVar16);
      iVar13 = iVar13 + iVar6;
      bVar16 = false;
    }
    iVar6 = writeTSFrames(this,this->m_pesPID,buffer,(long)ppVar14->second,true,bVar16);
    iVar13 = iVar13 + iVar6;
    puVar12 = buffer + ppVar14->second;
  }
  iVar6 = writeTSFrames(this,this->m_pesPID,puVar12,(int64_t)(puVar11 + (sVar1 - (long)puVar12)),
                        false,bVar16);
  MemoryBlock::resize(&this->m_pesData,0);
  ppVar14 = (this->m_priorityData).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_priorityData).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar14) {
    (this->m_priorityData).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar14;
  }
  if (bVar15) {
    lVar10 = std::_Rb_tree_decrement
                       (&(pmVar8->m_index).
                         super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t._M_impl.
                         super__Rb_tree_header._M_header);
    if (*(int *)(lVar10 + 0x2c) != 0) {
      __assert_fail("curIndex.rbegin()->second.m_frameLen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                    ,0x347,"void TSMuxer::writePESPacket()");
    }
    *(int *)(lVar10 + 0x2c) = (iVar13 + iVar6 + 1) * this->m_frameSize;
  }
  return;
}

Assistant:

TSMuxer::TSMuxer(MuxerManager* owner) : AbstractMuxer(owner)
{
    m_m2tsMode = false;
    m_vbvLen = DEFAULT_VBV_BUFFER_LEN * 90;
    m_lastPESDTS = -1;
    m_cbrBitrate = -1;  // mux CBR if bitrate specifed
    m_minBitrate = -1;
    m_pcrOnVideo = true;
    m_endStreamDTS = 0;
    m_prevM2TSPCROffset = 0;
    m_pesPID = 0;
    m_lastTSIndex = -1;
    m_lastPesLen = -1;
    m_lastMuxedDts = -1;
    m_lastPCR = -1;
    m_lastPMTPCR = -1;
    m_lastSITPCR = -1;
    m_nullCnt = 0;
    m_pmtCnt = 0;
    m_patCnt = 0;
    m_sitCnt = 0;
    m_needTruncate = false;
    m_videoTrackCnt = 0;
    m_DVvideoTrackCnt = 0;
    m_videoSecondTrackCnt = 0;
    m_audioTrackCnt = 0;
    m_secondaryAudioTrackCnt = 0;
    m_pgsTrackCnt = 0;
    m_beforePCRDataWrited = false;
    m_useNewStyleAudioPES = false;
    m_minDts = -1;
    m_pcrBits = 0;
    m_pcr_delta = -1;
    m_patPmtDelta = -1;
    m_firstPts.push_back(-1);
    m_lastPts.push_back(-1);
    m_muxedPacketCnt.push_back(0);
    m_interleaveInfo.emplace_back();
    m_pesIFrame = false;
    m_pesSpsPps = false;
    m_computeMuxStats = false;
    m_pmtFrames = 0;
    m_curFileStartPts = 0;  // FIXED_PTS_OFFSET;
    m_splitSize = 0;
    m_splitDuration = 0;
    m_curFileNum = 0;
    m_bluRayMode = false;
    m_hdmvDescriptors = true;
    m_lastGopNullCnt = 0;
    m_outBufLen = 0;
    m_pesData.reserve(1024 * 128);
    m_mainStreamIndex = -1;
    m_muxFile = nullptr;
    m_isExternalFile = false;
    m_writeBlockSize = 0;
    m_frameSize = 188;

    m_processedBlockSize = 0;
    m_sublingMuxer = nullptr;
    m_outBuf = nullptr;
    m_masterMode = false;
    m_subMode = false;
    setPtsOffset(0);
    m_canSwithBlock = true;
    m_additionCLPISize = 0;
#ifdef _DEBUG
    m_lastProcessedDts = -1000000000;
    m_lastStreamIndex = -1;
#endif
}